

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_decompress_safe_forceExtDict
              (char *source,char *dest,int compressedSize,int maxOutputSize,void *dictStart,
              size_t dictSize)

{
  char *pcVar1;
  char *pcVar2;
  byte *pbVar3;
  char *pcVar4;
  byte bVar5;
  char cVar6;
  uint uVar7;
  undefined8 uVar8;
  ushort uVar9;
  ushort uVar10;
  long lVar11;
  ushort *puVar12;
  char *pcVar13;
  ulong __n;
  ushort *puVar14;
  long lVar15;
  size_t __n_00;
  char *pcVar16;
  ushort *__src;
  char *pcVar17;
  char *pcVar18;
  int iVar19;
  BYTE *s;
  ulong uVar20;
  ulong __n_01;
  char *pcVar21;
  BYTE *oCopyLimit;
  int local_58;
  
  iVar19 = -1;
  if (-1 < maxOutputSize && source != (char *)0x0) {
    lVar11 = (long)dictStart + dictSize;
    if (dictStart == (void *)0x0) {
      lVar11 = 0;
    }
    if (maxOutputSize == 0) {
      if (compressedSize == 1) {
        iVar19 = -(uint)(*source != '\0');
      }
    }
    else if (compressedSize != 0) {
      pbVar3 = (byte *)(source + compressedSize);
      pcVar4 = dest + (uint)maxOutputSize;
      pcVar1 = pcVar4 + -7;
      pcVar18 = dest;
      puVar14 = (ushort *)source;
      do {
        while( true ) {
          __src = (ushort *)((long)puVar14 + 1);
          bVar5 = (byte)*puVar14;
          __n_00 = (size_t)(uint)(bVar5 >> 4);
          if (bVar5 >> 4 == 0xf) break;
          if ((source + (long)compressedSize + -0x10 <= __src) ||
             (dest + ((ulong)(uint)maxOutputSize - 0x20) < pcVar18)) goto LAB_0011ab13;
          uVar8 = *(undefined8 *)((long)puVar14 + 9);
          *(undefined8 *)pcVar18 = *(undefined8 *)__src;
          *(undefined8 *)(pcVar18 + 8) = uVar8;
          pcVar16 = pcVar18 + __n_00;
          uVar20 = (ulong)(bVar5 & 0xf);
          puVar14 = (ushort *)((long)__src + __n_00);
          __src = puVar14 + 1;
          uVar9 = *puVar14;
          pcVar13 = pcVar16 + -(ulong)uVar9;
          if (((uVar20 == 0xf) || (uVar9 < 8)) || (pcVar13 < dest)) goto LAB_0011abc9;
          *(undefined8 *)pcVar16 = *(undefined8 *)pcVar13;
          *(undefined8 *)(pcVar16 + 8) = *(undefined8 *)(pcVar13 + 8);
          *(undefined2 *)(pcVar16 + 0x10) = *(undefined2 *)(pcVar13 + 0x10);
          pcVar18 = pcVar16 + uVar20 + 4;
          puVar14 = __src;
        }
        if (pbVar3 + -0xf <= __src) goto LAB_0011ae36;
        puVar14 = puVar14 + 1;
        lVar15 = 0;
        puVar12 = __src;
        do {
          __src = (ushort *)((long)puVar12 + 1);
          if (pbVar3 + -0xf < __src) goto LAB_0011ae36;
          uVar9 = *puVar12;
          lVar15 = lVar15 + (ulong)(byte)uVar9;
          puVar14 = (ushort *)((long)puVar14 + 1);
          puVar12 = __src;
        } while ((ulong)(byte)uVar9 == 0xff);
        if (((lVar15 == -1) || (__n_00 = lVar15 + 0xf, CARRY8((ulong)pcVar18,__n_00))) ||
           ((ulong)-(long)puVar14 < __n_00)) goto LAB_0011ae36;
LAB_0011ab13:
        pcVar16 = pcVar18 + __n_00;
        if ((pcVar4 + -0xc < pcVar16) ||
           (puVar14 = (ushort *)((long)__src + __n_00), pbVar3 + -8 < puVar14)) {
          if (((byte *)((long)__src + __n_00) == pbVar3) && (pcVar16 <= pcVar4)) {
            memmove(pcVar18,__src,__n_00);
            return (int)pcVar16 - (int)dest;
          }
LAB_0011ae36:
          local_58 = (int)source;
          return ~(uint)__src + local_58;
        }
        do {
          *(undefined8 *)pcVar18 = *(undefined8 *)__src;
          pcVar18 = pcVar18 + 8;
          __src = __src + 4;
        } while (pcVar18 < pcVar16);
        uVar9 = *puVar14;
        __src = puVar14 + 1;
        pcVar13 = pcVar16 + -(ulong)uVar9;
        uVar20 = (ulong)(bVar5 & 0xf);
LAB_0011abc9:
        if ((int)uVar20 == 0xf) {
          lVar15 = 0;
          puVar14 = __src;
          do {
            __src = (ushort *)((long)puVar14 + 1);
            if (pbVar3 + -4 < __src) goto LAB_0011ae36;
            uVar10 = *puVar14;
            lVar15 = lVar15 + (ulong)(byte)uVar10;
            puVar14 = __src;
          } while ((ulong)(byte)uVar10 == 0xff);
          uVar20 = lVar15 + 0xf;
          if ((lVar15 == -1) || (CARRY8((ulong)pcVar16,uVar20))) goto LAB_0011ae36;
        }
        if ((dictSize < 0x10000) && (pcVar13 + dictSize < dest)) goto LAB_0011ae36;
        uVar20 = uVar20 + 4;
        pcVar21 = pcVar16 + uVar20;
        pcVar18 = pcVar21;
        puVar14 = __src;
        if (pcVar13 < dest) {
          if (pcVar4 + -5 < pcVar21) goto LAB_0011ae36;
          __n_01 = (long)dest - (long)pcVar13;
          __n = uVar20 - __n_01;
          if (uVar20 < __n_01 || __n == 0) {
            memmove(pcVar16,(void *)(lVar11 - __n_01),uVar20);
          }
          else {
            memcpy(pcVar16,(void *)(lVar11 - __n_01),__n_01);
            pcVar18 = pcVar16 + __n_01;
            if ((ulong)((long)pcVar18 - (long)dest) < __n) {
              pcVar16 = dest;
              if ((long)__n_01 < (long)uVar20) {
                do {
                  *pcVar18 = *pcVar16;
                  pcVar18 = pcVar18 + 1;
                  pcVar16 = pcVar16 + 1;
                } while (pcVar18 < pcVar21);
              }
            }
            else {
              memcpy(pcVar18,dest,__n);
              pcVar18 = pcVar21;
            }
          }
        }
        else {
          if (uVar9 < 8) {
            pcVar16[0] = '\0';
            pcVar16[1] = '\0';
            pcVar16[2] = '\0';
            pcVar16[3] = '\0';
            *pcVar16 = *pcVar13;
            pcVar16[1] = pcVar13[1];
            pcVar16[2] = pcVar13[2];
            pcVar16[3] = pcVar13[3];
            uVar7 = inc32table[uVar9];
            *(undefined4 *)(pcVar16 + 4) = *(undefined4 *)(pcVar13 + uVar7);
            pcVar13 = pcVar13 + ((ulong)uVar7 - (long)dec64table[uVar9]);
          }
          else {
            *(undefined8 *)pcVar16 = *(undefined8 *)pcVar13;
            pcVar13 = pcVar13 + 8;
          }
          pcVar2 = pcVar16 + 8;
          if (pcVar4 + -0xc < pcVar21) {
            if (pcVar4 + -5 < pcVar21) goto LAB_0011ae36;
            pcVar16 = pcVar13;
            pcVar17 = pcVar2;
            if (pcVar2 < pcVar1) {
              do {
                *(undefined8 *)pcVar17 = *(undefined8 *)pcVar16;
                pcVar17 = pcVar17 + 8;
                pcVar16 = pcVar16 + 8;
              } while (pcVar17 < pcVar1);
              pcVar13 = pcVar13 + ((long)pcVar1 - (long)pcVar2);
              pcVar2 = pcVar1;
            }
            for (; pcVar2 < pcVar21; pcVar2 = pcVar2 + 1) {
              cVar6 = *pcVar13;
              pcVar13 = pcVar13 + 1;
              *pcVar2 = cVar6;
            }
          }
          else {
            *(undefined8 *)pcVar2 = *(undefined8 *)pcVar13;
            if (0x10 < uVar20) {
              pcVar16 = pcVar16 + 0x10;
              do {
                pcVar13 = pcVar13 + 8;
                *(undefined8 *)pcVar16 = *(undefined8 *)pcVar13;
                pcVar16 = pcVar16 + 8;
              } while (pcVar16 < pcVar21);
            }
          }
        }
      } while( true );
    }
  }
  return iVar19;
}

Assistant:

LZ4_FORCE_O2
int LZ4_decompress_safe_forceExtDict(const char* source, char* dest,
                                     int compressedSize, int maxOutputSize,
                                     const void* dictStart, size_t dictSize)
{
    return LZ4_decompress_generic(source, dest, compressedSize, maxOutputSize,
                                  decode_full_block, usingExtDict,
                                  (BYTE*)dest, (const BYTE*)dictStart, dictSize);
}